

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_parse_result *
pugi::impl::anon_unknown_0::load_buffer_impl
          (xml_parse_result *__return_storage_ptr__,xml_document_struct *doc,xml_node_struct *root,
          void *contents,size_t size,uint options,xml_encoding encoding,bool is_mutable,bool own,
          char_t **out_buffer)

{
  xml_node_struct **ppxVar1;
  byte bVar2;
  code *pcVar3;
  code *pcVar4;
  xml_parse_result *pxVar5;
  bool bVar6;
  xml_encoding xVar7;
  undefined4 extraout_var;
  value_type vVar8;
  char_t *pcVar9;
  value_type puVar10;
  value_type puVar11;
  size_t sVar12;
  xml_node_struct *pxVar13;
  xml_node_struct *pxVar14;
  xml_attribute_struct *pxVar15;
  char_t *pcVar16;
  xml_node_struct **ppxVar17;
  byte bVar18;
  byte bVar19;
  ushort uVar20;
  ushort *puVar21;
  char *pcVar22;
  long lVar23;
  byte *pbVar24;
  long lVar25;
  uint uVar26;
  xml_document_struct *alloc;
  byte *pbVar27;
  long lVar28;
  ulong uVar29;
  xml_parse_status xVar30;
  ushort *puVar31;
  byte bVar32;
  ushort uVar33;
  long lVar34;
  long lVar35;
  size_t sVar36;
  byte *pbVar37;
  byte *pbVar38;
  byte *pbVar39;
  size_t sVar40;
  byte *pbVar41;
  ulong uVar42;
  long lStack_f0;
  byte *local_d0;
  xml_document_struct *local_c8;
  ushort *local_c0;
  size_t length;
  char_t *buffer;
  undefined8 local_a8;
  byte *local_a0;
  xml_parse_result *local_98;
  uint local_8c;
  gap local_88;
  xml_node_struct *local_78;
  xml_node_struct *local_70;
  auto_deleter<void> contents_guard;
  
  if (size != 0 && contents == (void *)0x0) {
    __return_storage_ptr__->encoding = encoding_auto;
    __return_storage_ptr__->status = status_io_error;
    __return_storage_ptr__->offset = 0;
    return __return_storage_ptr__;
  }
  local_c8 = doc;
  xVar7 = get_buffer_encoding(encoding,contents,size);
  local_a8 = CONCAT44(extraout_var,xVar7);
  contents_guard.data = (void *)0x0;
  if (own) {
    contents_guard.data = contents;
  }
  buffer = (char_t *)0x0;
  length = 0;
  contents_guard.deleter =
       (D)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate;
  lVar23 = 1;
  local_c0 = (ushort *)contents;
  local_98 = __return_storage_ptr__;
  local_70 = root;
  if (xVar7 == encoding_utf8) {
LAB_00212ee4:
    bVar6 = get_mutable_buffer(&buffer,&length,contents,size,is_mutable);
    if (bVar6) goto LAB_00213414;
  }
  else if ((xVar7 & ~encoding_utf8) == encoding_utf16_le) {
    uVar42 = size >> 1;
    if (xVar7 == encoding_utf16_le) {
      lVar28 = 0;
      lVar25 = -1;
      puVar31 = (ushort *)contents;
      for (uVar29 = uVar42; uVar29 != 0; uVar29 = uVar29 + lVar35) {
        uVar20 = *puVar31;
        lVar35 = lVar25;
        if (uVar20 < 0xd800) {
          lVar34 = 3 - (ulong)(uVar20 < 0x800);
          if (uVar20 < 0x80) {
            lVar34 = lVar23;
          }
          lVar28 = lVar28 + lVar34;
LAB_00212f97:
          puVar21 = puVar31 + 1;
        }
        else {
          if ((~uVar20 & 0xe000) == 0) {
            lVar28 = lVar28 + 3;
            goto LAB_00212f97;
          }
          puVar21 = puVar31 + 1;
          if (((uVar29 != 1) && ((uVar20 & 0xfc00) == 0xd800)) && ((*puVar21 & 0xfc00) == 0xdc00)) {
            lVar28 = lVar28 + 4;
            puVar21 = puVar31 + 2;
            lVar35 = -2;
          }
        }
        puVar31 = puVar21;
      }
      sVar36 = lVar28 + 1;
      puVar10 = (value_type)
                (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                          allocate)(sVar36);
      if (puVar10 != (value_type)0x0) {
        lVar23 = -1;
        puVar11 = puVar10;
        puVar31 = local_c0;
        for (; uVar42 != 0; uVar42 = uVar42 + lStack_f0) {
          uVar20 = *puVar31;
          uVar26 = (uint)uVar20;
          lStack_f0 = lVar23;
          if ((uVar20 < 0xd800) || ((~uVar20 & 0xe000) == 0)) {
            puVar11 = utf8_writer::low(puVar11,uVar26);
            puVar21 = puVar31 + 1;
          }
          else {
            puVar21 = puVar31 + 1;
            if (((uVar42 != 1) && ((uVar26 & 0xfc00) == 0xd800)) && ((*puVar21 & 0xfc00) == 0xdc00))
            {
              puVar11 = utf8_writer::high(puVar11,(uVar26 & 0x3ff) * 0x400 + (*puVar21 & 0x3ff) +
                                                  0x10000);
              puVar21 = puVar31 + 2;
              lStack_f0 = -2;
            }
          }
          puVar31 = puVar21;
        }
        if (puVar11 != puVar10 + lVar28) {
          pcVar22 = 
          "bool pugi::impl::(anonymous namespace)::convert_buffer_generic(char_t *&, size_t &, const void *, size_t, D) [D = pugi::impl::(anonymous namespace)::utf16_decoder<pugi::impl::(anonymous namespace)::opt_false>]"
          ;
LAB_0021449c:
          __assert_fail("oend == obegin + length",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                        ,0x89f,pcVar22);
        }
LAB_00213407:
        *puVar11 = '\0';
        length = sVar36;
        buffer = (char_t *)puVar10;
LAB_00213414:
        pcVar9 = buffer;
        contents_guard.data = (void *)0x0;
        if (own) {
          if (local_c0 != (ushort *)0x0 && (ushort *)buffer != local_c0) {
            (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate
            )(local_c0);
          }
LAB_00213455:
          *out_buffer = pcVar9;
        }
        else if ((ushort *)buffer != local_c0) goto LAB_00213455;
        sVar36 = length;
        local_c8->buffer = pcVar9;
        if (length != 0) {
          if (local_70->first_child == (xml_node_struct *)0x0) {
            local_78 = (xml_node_struct *)0x0;
          }
          else {
            local_78 = local_70->first_child->prev_sibling_c;
          }
          bVar2 = pcVar9[length - 1];
          pcVar9[length - 1] = '\0';
          pbVar37 = (byte *)pcVar9;
          if ((*pcVar9 == -0x11) && (pcVar9[1] == -0x45)) {
            pbVar37 = (byte *)(pcVar9 + (ulong)(pcVar9[2] == -0x41) * 3);
          }
          ppxVar1 = &local_70->first_child;
          local_c8 = (xml_document_struct *)&local_c8->super_xml_allocator;
          local_a0 = (byte *)(length - 1);
          pcVar3 = *(code **)((long)&PTR_parse_simple_003e5340 + (ulong)(options >> 1 & 0x78));
          pcVar4 = (code *)(&PTR_parse_003e53c0)[options >> 9 & 4 | options >> 4 & 3];
          local_c0 = (ushort *)
                     CONCAT71(local_c0._1_7_,(options >> 0xb & 1) == 0 && (options & 0x408) != 0);
          local_8c = options & 0x22;
          bVar32 = bVar2 ^ 0x3e;
          alloc = local_c8;
          pxVar13 = local_70;
LAB_00213581:
          do {
            bVar18 = *pbVar37;
            while( true ) {
              pbVar39 = pbVar37;
              if (bVar18 == 0) goto LAB_002141a0;
              if (bVar18 == 0x3c) goto LAB_0021361d;
              lVar23 = 0;
              while (((anonymous_namespace)::chartype_table[bVar18] & 8) != 0) {
                bVar18 = pbVar39[lVar23 + 1];
                lVar23 = lVar23 + 1;
              }
              if ((bVar18 != 0x3c) && (bVar18 != 0)) break;
              if (lVar23 == 0) {
                __assert_fail("mark != s",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                              ,0xd74,
                              "char_t *pugi::impl::(anonymous namespace)::xml_parser::parse_tree(char_t *, xml_node_struct *, unsigned int, char_t)"
                             );
              }
              pbVar37 = pbVar39 + lVar23;
              if (((char)local_c0 != '\0') &&
                 (((options >> 10 & 1) == 0 ||
                  (((bVar18 == 0x3c && (pbVar39[lVar23 + 1] == 0x2f)) &&
                   (pxVar13->first_child == (xml_node_struct *)0x0)))))) break;
            }
            if ((options >> 0xb & 1) != 0) {
              pbVar39 = pbVar39 + lVar23;
            }
            if (((options >> 0xc & 1) != 0) || (pxVar13->parent != (xml_node_struct *)0x0)) {
              if ((((options >> 0xd & 1) == 0) ||
                  ((pxVar13->parent == (xml_node_struct *)0x0 ||
                   (pxVar13->first_child != (xml_node_struct *)0x0)))) ||
                 (pxVar13->value != (char_t *)0x0)) {
                pxVar13 = append_new_node(pxVar13,(xml_allocator *)alloc,node_pcdata);
                if (pxVar13 != (xml_node_struct *)0x0) {
                  pxVar13->value = (char_t *)pbVar39;
                  pxVar13 = pxVar13->parent;
                  goto LAB_00213664;
                }
                goto LAB_002141ed;
              }
              pxVar13->value = (char_t *)pbVar39;
LAB_00213664:
              pbVar39 = (byte *)(*pcVar4)(pbVar39);
              bVar18 = *pbVar39;
              alloc = local_c8;
              if (bVar18 != 0) goto LAB_00213683;
LAB_002141a0:
              pbVar41 = (byte *)0x0;
              if (pxVar13 != local_70) {
                pbVar41 = pbVar39;
              }
              xVar30 = status_end_element_mismatch;
              if (pxVar13 == local_70) {
                xVar30 = status_ok;
              }
              goto LAB_002142e4;
            }
            while( true ) {
              if (*pbVar39 == 0) goto LAB_002141a0;
              if (*pbVar39 == 0x3c) break;
              pbVar39 = pbVar39 + 1;
            }
LAB_0021361d:
            bVar18 = pbVar39[1];
            pbVar39 = pbVar39 + 1;
LAB_00213683:
            if (-1 < (char)(anonymous_namespace)::chartype_table[bVar18]) {
              if (bVar18 == 0x21) {
                bVar18 = pbVar39[1];
                if (bVar18 == 0x5b) {
                  if (pbVar39[2] == 0x43) {
                    if (pbVar39[3] == 0x44) {
                      if (pbVar39[4] == 0x41) {
                        if (pbVar39[5] == 0x54) {
                          if (pbVar39[6] == 0x41) {
                            if (pbVar39[7] == 0x5b) {
                              pbVar39 = pbVar39 + 8;
                              pbVar41 = pbVar39;
                              if ((options & 4) == 0) {
                                do {
                                  if (*pbVar41 == 0x5d) {
                                    if (pbVar41[1] == 0x5d) {
                                      if ((pbVar41[2] == 0x3e) || (bVar32 == 0 && pbVar41[2] == 0))
                                      goto LAB_0021410b;
                                    }
                                  }
                                  else if (*pbVar41 == 0) goto LAB_002142d5;
                                  pbVar41 = pbVar41 + 1;
                                } while( true );
                              }
                              pxVar14 = append_new_node(pxVar13,(xml_allocator *)alloc,node_cdata);
                              if (pxVar14 != (xml_node_struct *)0x0) {
                                pxVar14->value = (char_t *)pbVar39;
                                if ((options & 0x20) != 0) {
                                  local_88.end = (char_t *)0x0;
                                  local_88.size = 0;
LAB_00213e66:
                                  do {
                                    while (bVar18 = *pbVar39,
                                          ((anonymous_namespace)::chartype_table[bVar18] & 0x10) ==
                                          0) {
                                      bVar18 = pbVar39[1];
                                      if (((anonymous_namespace)::chartype_table[bVar18] & 0x10) !=
                                          0) {
                                        pbVar39 = pbVar39 + 1;
                                        break;
                                      }
                                      bVar18 = pbVar39[2];
                                      if (((anonymous_namespace)::chartype_table[bVar18] & 0x10) !=
                                          0) {
                                        pbVar39 = pbVar39 + 2;
                                        break;
                                      }
                                      bVar18 = pbVar39[3];
                                      if (((anonymous_namespace)::chartype_table[bVar18] & 0x10) !=
                                          0) {
                                        pbVar39 = pbVar39 + 3;
                                        break;
                                      }
                                      pbVar39 = pbVar39 + 4;
                                    }
                                    if (bVar18 == 0xd) {
                                      local_d0 = pbVar39 + 1;
                                      *pbVar39 = 10;
                                      pbVar37 = pbVar39 + 1;
                                      pbVar39 = local_d0;
                                      if (*pbVar37 == 10) {
                                        gap::push(&local_88,(char_t **)&local_d0,1);
                                        pbVar39 = local_d0;
                                      }
                                      goto LAB_00213e66;
                                    }
                                    local_d0 = pbVar39;
                                    if (bVar18 == 0x5d) {
                                      if ((pbVar39[1] == 0x5d) &&
                                         ((pbVar39[2] == 0x3e || (bVar32 == 0 && pbVar39[2] == 0))))
                                      goto LAB_002140f7;
                                    }
                                    else if (bVar18 == 0) {
                                      pbVar41 = (byte *)pxVar14->value;
                                      goto LAB_002142d5;
                                    }
                                    pbVar39 = pbVar39 + 1;
                                  } while( true );
                                }
                                do {
                                  if (*pbVar41 == 0x5d) {
                                    if (pbVar41[1] == 0x5d) {
                                      if ((pbVar41[2] == 0x3e) || (bVar32 == 0 && pbVar41[2] == 0))
                                      goto LAB_002140ea;
                                    }
                                  }
                                  else if (*pbVar41 == 0) goto LAB_002142d5;
                                  pbVar41 = pbVar41 + 1;
                                } while( true );
                              }
                              goto LAB_002141ed;
                            }
                            pbVar41 = pbVar39 + 7;
                          }
                          else {
                            pbVar41 = pbVar39 + 6;
                          }
                        }
                        else {
                          pbVar41 = pbVar39 + 5;
                        }
                      }
                      else {
                        pbVar41 = pbVar39 + 4;
                      }
                    }
                    else {
                      pbVar41 = pbVar39 + 3;
                    }
                  }
                  else {
                    pbVar41 = pbVar39 + 2;
                  }
LAB_002142d5:
                  xVar30 = status_bad_cdata;
                }
                else {
                  pbVar41 = pbVar39 + 1;
                  if (bVar18 == 0x44) {
                    if ((((pbVar39[2] == 0x4f) && (pbVar39[3] == 0x43)) && (pbVar39[4] == 0x54)) &&
                       ((pbVar39[5] == 0x59 && (pbVar39[6] == 0x50)))) {
                      if ((pbVar39[7] != 0x45) && (bVar2 != 0x45 || pbVar39[7] != 0))
                      goto LAB_00214226;
                      pbVar37 = pbVar39 + -1;
                      if (pxVar13->parent == (xml_node_struct *)0x0) {
                        if ((*pbVar37 != 0x3c) && (*pbVar37 != 0)) {
                          __assert_fail("(s[0] == \'<\' || s[0] == 0) && s[1] == \'!\'",
                                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                                        ,0xbc6,
                                        "char_t *pugi::impl::(anonymous namespace)::xml_parser::parse_doctype_group(char_t *, char_t)"
                                       );
                        }
                        bVar18 = 0x44;
                        lVar23 = 0;
                        pbVar37 = pbVar41;
LAB_00213b53:
                        if ((bVar18 == 0x22) || (bVar18 == 0x27)) {
                          pbVar41 = pbVar37 + 1;
                          do {
                            pbVar37 = pbVar41;
                            bVar19 = *pbVar37;
                            pbVar41 = pbVar37 + 1;
                            if (bVar19 == 0) break;
                          } while (bVar19 != bVar18);
                          if (bVar19 == 0) goto LAB_002142dc;
                        }
                        else {
                          if (bVar18 == 0x3c) {
                            if (pbVar37[1] == 0x3f) {
                              pbVar37 = pbVar37 + 2;
                              do {
                                if (*pbVar37 == 0x3f) {
                                  if (pbVar37[1] == 0x3e) goto LAB_00213c50;
                                }
                                else if (*pbVar37 == 0) goto LAB_002142dc;
                                pbVar37 = pbVar37 + 1;
                              } while( true );
                            }
                            if (pbVar37[1] == 0x21) {
                              if (pbVar37[2] != 0x2d) {
                                if (pbVar37[2] == 0x5b) {
                                  pbVar41 = pbVar37 + 3;
                                  lVar25 = 0;
LAB_00213bd5:
                                  pbVar41 = pbVar41 + 3;
                                  do {
                                    bVar18 = pbVar41[-3];
                                    if (bVar18 == 0x3c) {
                                      if ((pbVar41[-2] == 0x21) && (pbVar41[-1] == 0x5b)) {
                                        lVar25 = lVar25 + 1;
                                        goto LAB_00213bd5;
                                      }
                                    }
                                    else if (bVar18 == 0x5d) {
                                      if ((pbVar41[-2] == 0x5d) && (pbVar41[-1] == 0x3e))
                                      goto LAB_00213c19;
                                    }
                                    else if (bVar18 == 0) {
                                      pbVar37 = pbVar41 + -3;
                                      goto LAB_002142dc;
                                    }
                                    pbVar41 = pbVar41 + 1;
                                  } while( true );
                                }
                                pbVar41 = pbVar37 + 2;
                                lVar23 = lVar23 + 1;
                                goto LAB_00213b9d;
                              }
                              if (pbVar37[3] == 0x2d) {
                                pbVar37 = pbVar37 + 4;
                                do {
                                  if (*pbVar37 == 0x2d) {
                                    if ((pbVar37[1] == 0x2d) && (pbVar37[2] == 0x3e))
                                    goto LAB_00213c9d;
                                  }
                                  else if (*pbVar37 == 0) break;
                                  pbVar37 = pbVar37 + 1;
                                } while( true );
                              }
                            }
                            goto LAB_002142dc;
                          }
                          if (bVar18 == 0x3e) {
                            if (lVar23 == 0) goto LAB_00214139;
                            lVar23 = lVar23 + -1;
                          }
                          else if (bVar18 == 0) goto LAB_00214125;
                          pbVar41 = pbVar37 + 1;
                        }
                        goto LAB_00213b9d;
                      }
                      goto LAB_002142dc;
                    }
LAB_00214226:
                    xVar30 = status_unrecognized_tag;
                  }
                  else if (bVar18 == 0x2d) {
                    if (pbVar39[2] == 0x2d) {
                      pbVar39 = pbVar39 + 3;
                      pxVar14 = pxVar13;
                      if ((options & 2) == 0) {
LAB_0021388f:
                        if (local_8c != 0x22) {
                          do {
                            if (*pbVar39 == 0x2d) {
                              if (pbVar39[1] == 0x2d) {
                                bVar18 = pbVar39[2];
                                if ((bVar18 == 0x3e) || (bVar32 == 0 && bVar18 == 0))
                                goto LAB_0021406c;
                              }
                            }
                            else if (*pbVar39 == 0) goto LAB_002142ac;
                            pbVar39 = pbVar39 + 1;
                          } while( true );
                        }
                        local_88.end = (char_t *)0x0;
                        local_88.size = 0;
LAB_002138a2:
                        do {
                          while (bVar18 = *pbVar39,
                                ((anonymous_namespace)::chartype_table[bVar18] & 0x20) == 0) {
                            bVar18 = pbVar39[1];
                            if (((anonymous_namespace)::chartype_table[bVar18] & 0x20) != 0) {
                              pbVar39 = pbVar39 + 1;
                              break;
                            }
                            bVar18 = pbVar39[2];
                            if (((anonymous_namespace)::chartype_table[bVar18] & 0x20) != 0) {
                              pbVar39 = pbVar39 + 2;
                              break;
                            }
                            bVar18 = pbVar39[3];
                            if (((anonymous_namespace)::chartype_table[bVar18] & 0x20) != 0) {
                              pbVar39 = pbVar39 + 3;
                              break;
                            }
                            pbVar39 = pbVar39 + 4;
                          }
                          if (bVar18 == 0xd) {
                            local_d0 = pbVar39 + 1;
                            *pbVar39 = 10;
                            pbVar37 = pbVar39 + 1;
                            pbVar39 = local_d0;
                            if (*pbVar37 == 10) {
                              gap::push(&local_88,(char_t **)&local_d0,1);
                              pbVar39 = local_d0;
                            }
                            goto LAB_002138a2;
                          }
                          local_d0 = pbVar39;
                          if (bVar18 == 0x2d) {
                            if ((pbVar39[1] == 0x2d) &&
                               ((pbVar39[2] == 0x3e || (bVar32 == 0 && pbVar39[2] == 0))))
                            goto LAB_0021408c;
                          }
                          else if (bVar18 == 0) {
                            pbVar39 = (byte *)pxVar14->value;
                            goto LAB_002142ac;
                          }
                          pbVar39 = pbVar39 + 1;
                        } while( true );
                      }
                      pxVar14 = append_new_node(pxVar13,(xml_allocator *)alloc,node_comment);
                      if (pxVar14 != (xml_node_struct *)0x0) {
                        pxVar14->value = (char_t *)pbVar39;
                        alloc = local_c8;
                        goto LAB_0021388f;
                      }
                      goto LAB_002141ed;
                    }
                    pbVar39 = pbVar39 + 2;
LAB_002142ac:
                    xVar30 = status_bad_comment;
                    pbVar41 = pbVar39;
                  }
                  else if ((bVar2 == 0x2d) && (bVar18 == 0)) {
                    xVar30 = status_bad_comment;
                  }
                  else {
                    xVar30 = (uint)(bVar2 == 0x5b && bVar18 == 0) * 3 + status_unrecognized_tag;
                  }
                }
              }
              else if (bVar18 == 0x3f) {
                pbVar38 = pbVar39 + 1;
                pbVar41 = pbVar38;
                if ((char)(anonymous_namespace)::chartype_table[pbVar39[1]] < '\0') {
                  lVar23 = 4;
                  pbVar41 = pbVar39 + 3;
                  pbVar27 = pbVar39 + 1;
                  lVar25 = 1;
                  do {
                    lVar28 = lVar25;
                    pbVar37 = pbVar27;
                    pbVar24 = pbVar41;
                    uVar42 = (ulong)*pbVar37;
                    pbVar27 = pbVar37 + 1;
                    lVar23 = lVar23 + -1;
                    pbVar41 = pbVar24 + 1;
                    lVar25 = lVar28 + 1;
                  } while (((anonymous_namespace)::chartype_table[uVar42] & 0x40) != 0);
                  pbVar41 = pbVar37;
                  if (*pbVar37 == 0) goto LAB_00214200;
                  pbVar41 = pbVar39 + lVar28;
                  if (((pbVar39[1] & 0xdf) == 0x58) && ((pbVar39[2] & 0xdf) == 0x4d)) {
                    bVar6 = (pbVar39[3] & 0xdf) != 0x4c;
                    uVar26 = 1;
                    if (lVar23 == 0 && !bVar6) {
                      uVar26 = 0x100;
                    }
                    if ((options & uVar26) == 0) {
LAB_002139a4:
                      do {
                        if ((char)uVar42 == '?') {
                          bVar18 = pbVar37[1];
                          if ((bVar18 == 0x3e) || (bVar32 == 0 && bVar18 == 0)) goto LAB_00213dba;
                        }
                        else {
                          pbVar41 = pbVar37;
                          if ((int)uVar42 == 0) goto LAB_00214200;
                          bVar18 = pbVar37[1];
                        }
                        uVar42 = (ulong)bVar18;
                        pbVar37 = pbVar37 + 1;
                      } while( true );
                    }
                    if (lVar23 != 0 || bVar6) goto LAB_00213a70;
                    if (pxVar13->parent != (xml_node_struct *)0x0) goto LAB_00214200;
                    pxVar13 = append_new_node(pxVar13,(xml_allocator *)local_c8,node_declaration);
                    pbVar39 = pbVar41;
                    if (pxVar13 == (xml_node_struct *)0x0) goto LAB_002141ed;
                    bVar6 = true;
                  }
                  else {
                    if ((options & 1) == 0) goto LAB_002139a4;
LAB_00213a70:
                    pxVar13 = append_new_node(pxVar13,(xml_allocator *)local_c8,node_pi);
                    pbVar39 = pbVar41;
                    if (pxVar13 == (xml_node_struct *)0x0) goto LAB_002141ed;
                    bVar6 = false;
                  }
                  pxVar13->name = (char_t *)pbVar38;
                  bVar18 = *pbVar37;
                  *pbVar37 = 0;
                  if ((ulong)bVar18 != 0x3f) {
                    pbVar41 = pbVar27;
                    if (((anonymous_namespace)::chartype_table[bVar18] & 8) != 0) {
                      do {
                        pbVar39 = pbVar24;
                        uVar42 = (ulong)pbVar37[1];
                        pbVar37 = pbVar37 + 1;
                        pbVar24 = pbVar39 + 1;
                      } while (((anonymous_namespace)::chartype_table[uVar42] & 8) != 0);
                      do {
                        if ((char)uVar42 == '?') {
                          bVar18 = *pbVar39;
                          if ((bVar18 == 0x3e) || (bVar32 == 0 && bVar18 == 0)) goto LAB_00213e3d;
                        }
                        else {
                          if ((int)uVar42 == 0) {
                            pbVar41 = pbVar39 + -1;
                            break;
                          }
                          bVar18 = *pbVar39;
                        }
                        uVar42 = (ulong)bVar18;
                        pbVar39 = pbVar39 + 1;
                      } while( true );
                    }
                    goto LAB_00214200;
                  }
                  bVar18 = *pbVar27;
                  if ((bVar18 != 0x3e) && (bVar32 != 0 || bVar18 != 0)) {
                    pbVar41 = pbVar41 + 1;
                    goto LAB_00214200;
                  }
                  pbVar37 = pbVar27 + (bVar18 == 0x3e);
                  pxVar13 = pxVar13->parent;
                  goto LAB_00213f3a;
                }
LAB_00214200:
                xVar30 = status_bad_pi;
              }
              else if (bVar18 == 0x2f) {
                pbVar39 = pbVar39 + 1;
                pbVar37 = (byte *)pxVar13->name;
                pbVar38 = pbVar39;
                if (pbVar37 == (byte *)0x0) {
LAB_002141e0:
                  xVar30 = status_end_element_mismatch;
                  pbVar41 = pbVar39;
                }
                else {
                  while (bVar18 = *pbVar38,
                        ((anonymous_namespace)::chartype_table[bVar18] & 0x40) != 0) {
                    bVar19 = *pbVar37;
                    pbVar37 = pbVar37 + 1;
                    pbVar38 = pbVar38 + 1;
                    if (bVar18 != bVar19) goto LAB_002141e0;
                  }
                  if (*pbVar37 == 0) goto code_r0x002139e3;
                  xVar30 = status_bad_end_element;
                  if (((bVar18 != 0) || (*pbVar37 != bVar2)) || (pbVar41 = pbVar38, pbVar37[1] != 0)
                     ) {
                    xVar30 = status_end_element_mismatch;
                    pbVar41 = pbVar39;
                  }
                }
              }
              else {
                xVar30 = (bVar2 == 0x3f && bVar18 == 0) + status_unrecognized_tag;
                pbVar41 = pbVar39;
              }
              goto LAB_002142e4;
            }
            pxVar13 = append_new_node(pxVar13,(xml_allocator *)alloc,node_element);
            if (pxVar13 == (xml_node_struct *)0x0) goto LAB_002141ed;
            pxVar13->name = (char_t *)pbVar39;
            pbVar37 = pbVar39 + 1;
            do {
              pbVar39 = pbVar37;
              uVar42 = (ulong)pbVar39[-1];
              bVar18 = (anonymous_namespace)::chartype_table[uVar42];
              if ((bVar18 & 0x40) == 0) {
                pbVar39 = pbVar39 + -1;
                goto LAB_00213a16;
              }
              uVar42 = (ulong)*pbVar39;
              bVar18 = (anonymous_namespace)::chartype_table[uVar42];
              if ((bVar18 & 0x40) == 0) goto LAB_00213a16;
              uVar42 = (ulong)pbVar39[1];
              bVar18 = (anonymous_namespace)::chartype_table[uVar42];
              if ((bVar18 & 0x40) == 0) {
                pbVar39 = pbVar39 + 1;
                goto LAB_00213a16;
              }
              uVar42 = (ulong)pbVar39[2];
              bVar18 = (anonymous_namespace)::chartype_table[uVar42];
              pbVar37 = pbVar39 + 4;
            } while ((bVar18 & 0x40) != 0);
            pbVar39 = pbVar39 + 2;
LAB_00213a16:
            *pbVar39 = 0;
            pbVar37 = pbVar39 + 1;
            alloc = local_c8;
          } while ((char)uVar42 == '>');
          if ((bVar18 & 8) != 0) goto LAB_00213f52;
          if ((char)uVar42 == '\0') {
            pbVar37 = pbVar39;
            if (bVar2 == 0x3e) goto LAB_00213581;
          }
          else {
            pbVar39 = pbVar37;
            if ((int)uVar42 == 0x2f) {
              bVar18 = *pbVar37;
              if ((bVar18 != 0x3e) && (bVar32 != 0 || bVar18 != 0)) goto LAB_002143c0;
              pxVar13 = pxVar13->parent;
              pbVar37 = pbVar37 + (bVar18 == 0x3e);
              goto LAB_00213581;
            }
          }
          goto LAB_002143c0;
        }
        local_98->status = ~options >> 8 & status_no_document_element;
        local_98->offset = 0;
        goto LAB_00214392;
      }
    }
    else {
      lVar25 = -1;
      lVar28 = 0;
      puVar31 = (ushort *)contents;
      for (uVar29 = uVar42; uVar29 != 0; uVar29 = uVar29 + lVar35) {
        uVar20 = *puVar31 << 8;
        uVar33 = uVar20 | *puVar31 >> 8;
        lVar35 = lVar25;
        if (uVar33 < 0xd800) {
          lVar34 = 3 - (ulong)(uVar33 < 0x800);
          if (uVar33 < 0x80) {
            lVar34 = lVar23;
          }
          lVar28 = lVar28 + lVar34;
LAB_002130ad:
          puVar21 = puVar31 + 1;
        }
        else {
          if ((~uVar33 & 0xe000) == 0) {
            lVar28 = lVar28 + 3;
            goto LAB_002130ad;
          }
          puVar21 = puVar31 + 1;
          if (((uVar29 != 1) && ((uVar20 & 0xfc00) == 0xd800)) && ((*puVar21 & 0xfc) == 0xdc)) {
            lVar28 = lVar28 + 4;
            puVar21 = puVar31 + 2;
            lVar35 = -2;
          }
        }
        puVar31 = puVar21;
      }
      puVar10 = (value_type)
                (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                          allocate)(lVar28 + 1U);
      if (puVar10 != (value_type)0x0) {
        lVar23 = -1;
        puVar11 = puVar10;
        puVar31 = local_c0;
        for (; uVar42 != 0; uVar42 = uVar42 + lStack_f0) {
          uVar20 = *puVar31 << 8 | *puVar31 >> 8;
          uVar26 = (uint)uVar20;
          lStack_f0 = lVar23;
          if ((uVar20 < 0xd800) || ((~uVar26 & 0xe000) == 0)) {
            puVar11 = utf8_writer::low(puVar11,uVar26);
            puVar21 = puVar31 + 1;
          }
          else {
            puVar21 = puVar31 + 1;
            if (((uVar42 != 1) && ((uVar26 & 0xfc00) == 0xd800)) &&
               (uVar26 = (uint)(ushort)(*puVar21 << 8 | *puVar21 >> 8), (uVar26 & 0xfc00) == 0xdc00)
               ) {
              puVar11 = utf8_writer::high(puVar11,(uVar20 & 0x3ff) * 0x400 + (uVar26 & 0x3ff) +
                                                  0x10000);
              puVar21 = puVar31 + 2;
              lStack_f0 = -2;
            }
          }
          puVar31 = puVar21;
        }
        if (puVar11 != puVar10 + lVar28) {
          pcVar22 = 
          "bool pugi::impl::(anonymous namespace)::convert_buffer_generic(char_t *&, size_t &, const void *, size_t, D) [D = pugi::impl::(anonymous namespace)::utf16_decoder<pugi::impl::(anonymous namespace)::opt_true>]"
          ;
          goto LAB_0021449c;
        }
        *puVar11 = '\0';
        length = lVar28 + 1U;
        buffer = (char_t *)puVar10;
        goto LAB_00213414;
      }
    }
  }
  else {
    if (1 < xVar7 - encoding_utf32_le) {
      if (xVar7 != encoding_latin1) {
        __assert_fail("false && \"Invalid encoding\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                      ,0x8f4,
                      "bool pugi::impl::(anonymous namespace)::convert_buffer(char_t *&, size_t &, xml_encoding, const void *, size_t, bool)"
                     );
      }
      lVar23 = 0;
      pcVar22 = (char *)contents;
LAB_002131c5:
      if (size + lVar23 != 0) {
        if (-1 < *pcVar22) goto code_r0x002131da;
        lVar25 = 0;
        sVar36 = -lVar23;
        for (sVar12 = sVar36; size != sVar12; sVar12 = sVar12 + 1) {
          lVar25 = (lVar25 - (ulong)(-1 < *(char *)((long)contents + sVar12))) + 2;
        }
        sVar40 = (lVar25 - lVar23) + 1;
        pcVar9 = (char_t *)
                 (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                           allocate)(sVar40);
        if (pcVar9 != (char_t *)0x0) {
          memcpy(pcVar9,local_c0,sVar36);
          puVar10 = (value_type)(pcVar9 + -lVar23);
          for (; size != sVar36; sVar36 = sVar36 + 1) {
            puVar10 = utf8_writer::low(puVar10,(uint)*(byte *)((long)local_c0 + sVar36));
          }
          if ((value_type)(pcVar9 + (lVar25 - lVar23)) != puVar10) {
            __assert_fail("oend == obegin + length",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                          ,0x8cd,
                          "bool pugi::impl::(anonymous namespace)::convert_buffer_latin1(char_t *&, size_t &, const void *, size_t, bool)"
                         );
          }
          *puVar10 = '\0';
          length = sVar40;
          buffer = pcVar9;
          goto LAB_00213414;
        }
        goto LAB_00212f0a;
      }
      goto LAB_00212ee4;
    }
    uVar42 = size >> 2;
    if (xVar7 == encoding_utf32_le) {
      vVar8 = utf32_decoder<pugi::impl::(anonymous_namespace)::opt_false>::
              process<pugi::impl::(anonymous_namespace)::utf8_counter>(contents,uVar42);
      pcVar9 = (char_t *)
               (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                         allocate)(vVar8 + 1);
      if (pcVar9 != (char_t *)0x0) {
        puVar10 = utf32_decoder<pugi::impl::(anonymous_namespace)::opt_false>::
                  process<pugi::impl::(anonymous_namespace)::utf8_writer>(local_c0,uVar42,pcVar9);
        if (puVar10 != (value_type)(pcVar9 + vVar8)) {
          pcVar22 = 
          "bool pugi::impl::(anonymous namespace)::convert_buffer_generic(char_t *&, size_t &, const void *, size_t, D) [D = pugi::impl::(anonymous namespace)::utf32_decoder<pugi::impl::(anonymous namespace)::opt_false>]"
          ;
          goto LAB_0021449c;
        }
        *puVar10 = '\0';
        length = vVar8 + 1;
        buffer = pcVar9;
        goto LAB_00213414;
      }
    }
    else {
      lVar25 = 0;
      for (uVar29 = 0; uVar42 != uVar29; uVar29 = uVar29 + 1) {
        uVar26 = *(uint *)((long)contents + uVar29 * 4);
        uVar26 = uVar26 >> 0x18 | (uVar26 & 0xff0000) >> 8 | (uVar26 & 0xff00) << 8 | uVar26 << 0x18
        ;
        if (uVar26 < 0x10000) {
          lVar28 = 3 - (ulong)(uVar26 < 0x800);
          if (uVar26 < 0x80) {
            lVar28 = lVar23;
          }
          lVar25 = lVar25 + lVar28;
        }
        else {
          lVar25 = lVar25 + 4;
        }
      }
      sVar36 = lVar25 + 1;
      puVar10 = (value_type)
                (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                          allocate)(sVar36);
      puVar31 = local_c0;
      if (puVar10 != (value_type)0x0) {
        puVar11 = puVar10;
        for (uVar29 = 0; uVar42 != uVar29; uVar29 = uVar29 + 1) {
          uVar26 = *(uint *)(puVar31 + uVar29 * 2);
          uVar26 = uVar26 >> 0x18 | (uVar26 & 0xff0000) >> 8 | (uVar26 & 0xff00) << 8 |
                   uVar26 << 0x18;
          if (uVar26 < 0x10000) {
            puVar11 = utf8_writer::low(puVar11,uVar26);
          }
          else {
            puVar11 = utf8_writer::high(puVar11,uVar26);
          }
        }
        if (puVar11 != puVar10 + lVar25) {
          pcVar22 = 
          "bool pugi::impl::(anonymous namespace)::convert_buffer_generic(char_t *&, size_t &, const void *, size_t, D) [D = pugi::impl::(anonymous namespace)::utf32_decoder<pugi::impl::(anonymous namespace)::opt_true>]"
          ;
          goto LAB_0021449c;
        }
        goto LAB_00213407;
      }
    }
  }
LAB_00212f0a:
  local_98->encoding = encoding_auto;
  local_98->status = status_out_of_memory;
  local_98->offset = 0;
  goto LAB_0021439b;
code_r0x002131da:
  lVar23 = lVar23 + -1;
  pcVar22 = pcVar22 + 1;
  goto LAB_002131c5;
LAB_002140f7:
  pcVar16 = gap::flush(&local_88,(char_t *)pbVar39);
  *pcVar16 = '\0';
  pbVar41 = pbVar39;
  goto LAB_0021410b;
LAB_002140ea:
  *pbVar41 = 0;
LAB_0021410b:
  alloc = local_c8;
  pbVar37 = pbVar41 + (ulong)(pbVar41[2] == 0x3e) + 2;
  goto LAB_00213581;
LAB_00214125:
  if ((bVar2 != 0x3e) || (lVar23 != 0)) {
LAB_002142dc:
    xVar30 = status_bad_doctype;
    pbVar41 = pbVar37;
    goto LAB_002142e4;
  }
LAB_00214139:
  if ((bVar18 != 0x3e) && (bVar32 != 0 || bVar18 != 0)) {
    __assert_fail("(*s == 0 && endch == \'>\') || *s == \'>\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                  ,0xc4a,
                  "char_t *pugi::impl::(anonymous namespace)::xml_parser::parse_exclamation(char_t *, xml_node_struct *, unsigned int, char_t)"
                 );
  }
  if (bVar18 != 0) {
    *pbVar37 = 0;
    pbVar37 = pbVar37 + 1;
  }
  if ((options >> 9 & 1) != 0) {
    pbVar41 = pbVar39 + 7;
    do {
      pbVar39 = pbVar41 + 1;
      pbVar41 = pbVar41 + 1;
    } while (((anonymous_namespace)::chartype_table[*pbVar39] & 8) != 0);
    pxVar14 = append_new_node(pxVar13,(xml_allocator *)alloc,node_doctype);
    pbVar39 = pbVar37;
    if (pxVar14 == (xml_node_struct *)0x0) {
LAB_002141ed:
      xVar30 = status_out_of_memory;
      pbVar41 = pbVar39;
      goto LAB_002142e4;
    }
    pxVar14->value = (char_t *)pbVar41;
    alloc = local_c8;
  }
  goto LAB_00213581;
LAB_00213c50:
  pbVar41 = pbVar37 + 2;
  goto LAB_00213b9d;
LAB_00213c9d:
  pbVar41 = pbVar37 + 3;
LAB_00213b9d:
  bVar18 = *pbVar41;
  pbVar37 = pbVar41;
  goto LAB_00213b53;
LAB_00213c19:
  if (lVar25 != 0) {
    lVar25 = lVar25 + -1;
    goto LAB_00213bd5;
  }
  goto LAB_00213b9d;
LAB_0021406c:
  if ((options & 2) != 0) {
    *pbVar39 = 0;
  }
  pbVar37 = pbVar39 + (ulong)(bVar18 == 0x3e) + 2;
  goto LAB_00213581;
LAB_0021408c:
  pcVar16 = gap::flush(&local_88,(char_t *)pbVar39);
  *pcVar16 = '\0';
  pbVar37 = pbVar39 + (ulong)(pbVar39[2] == 0x3e) + 2;
  goto LAB_00213581;
LAB_00213dba:
  pbVar37 = pbVar37 + (ulong)(bVar18 == 0x3e) + 1;
LAB_00213f3a:
  if (pxVar13 == (xml_node_struct *)0x0) {
    __assert_fail("cursor",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                  ,0xd60,
                  "char_t *pugi::impl::(anonymous namespace)::xml_parser::parse_tree(char_t *, xml_node_struct *, unsigned int, char_t)"
                 );
  }
  goto LAB_00213f43;
LAB_00213e3d:
  if (!bVar6) {
    pxVar13->value = (char_t *)pbVar37;
    pxVar13 = pxVar13->parent;
    pbVar39[-1] = 0;
    pbVar37 = pbVar39 + (*pbVar39 == 0x3e);
    goto LAB_00213f3a;
  }
  pbVar39[-1] = 0x2f;
LAB_00213f43:
  alloc = local_c8;
  if ((pxVar13->header & 0xf) != 7) goto LAB_00213581;
LAB_00213f52:
  while( true ) {
    do {
      pbVar39 = pbVar37;
      bVar18 = *pbVar39;
      pbVar37 = pbVar39 + 1;
    } while (((anonymous_namespace)::chartype_table[bVar18] & 8) != 0);
    if (-1 < (char)(anonymous_namespace)::chartype_table[bVar18]) break;
    pxVar15 = append_new_attribute(pxVar13,(xml_allocator *)alloc);
    if (pxVar15 == (xml_attribute_struct *)0x0) goto LAB_002141ed;
    pxVar15->name = (char_t *)pbVar39;
    pbVar39 = pbVar39 + 1;
    do {
      pbVar37 = pbVar39;
      bVar18 = pbVar37[-1];
      bVar19 = (anonymous_namespace)::chartype_table[bVar18];
      if ((bVar19 & 0x40) == 0) {
        pbVar37 = pbVar37 + -1;
        goto LAB_00213fd1;
      }
      bVar18 = *pbVar37;
      bVar19 = (anonymous_namespace)::chartype_table[bVar18];
      if ((bVar19 & 0x40) == 0) goto LAB_00213fd1;
      bVar18 = pbVar37[1];
      bVar19 = (anonymous_namespace)::chartype_table[bVar18];
      if ((bVar19 & 0x40) == 0) {
        pbVar37 = pbVar37 + 1;
        goto LAB_00213fd1;
      }
      bVar18 = pbVar37[2];
      bVar19 = (anonymous_namespace)::chartype_table[bVar18];
      pbVar39 = pbVar37 + 4;
    } while ((bVar19 & 0x40) != 0);
    pbVar37 = pbVar37 + 2;
LAB_00213fd1:
    *pbVar37 = 0;
    while (pbVar37 = pbVar37 + 1, (bVar19 & 8) != 0) {
      bVar18 = *pbVar37;
      bVar19 = (anonymous_namespace)::chartype_table[bVar18];
    }
    pbVar39 = pbVar37;
    if (bVar18 != 0x3d) goto LAB_00214216;
    do {
      pbVar37 = pbVar39;
      bVar18 = *pbVar37;
      pbVar39 = pbVar37 + 1;
    } while (((anonymous_namespace)::chartype_table[bVar18] & 8) != 0);
    if ((bVar18 != 0x22) && (bVar18 != 0x27)) goto LAB_00214216;
    pxVar15->value = (char_t *)pbVar39;
    pbVar37 = (byte *)(*pcVar3)(pbVar39,(int)(char)bVar18);
    if (pbVar37 == (byte *)0x0) {
      pbVar37 = (byte *)pxVar15->value;
      goto LAB_00214216;
    }
    alloc = local_c8;
    if ((char)(anonymous_namespace)::chartype_table[*pbVar37] < '\0') {
LAB_00214216:
      xVar30 = status_bad_attribute;
      pbVar41 = pbVar37;
      goto LAB_002142e4;
    }
  }
  if (bVar18 == 0x3e) goto LAB_00213581;
  if (bVar18 == 0x2f) {
    if (*pbVar37 == 0x3e) {
      pxVar13 = pxVar13->parent;
      pbVar37 = pbVar39 + 2;
      goto LAB_00213581;
    }
    pbVar39 = pbVar37;
    if ((bVar2 == 0x3e) && (*pbVar37 == 0)) {
      pxVar13 = pxVar13->parent;
      goto LAB_00213581;
    }
  }
  else if ((bVar2 == 0x3e) && (pbVar37 = pbVar39, bVar18 == 0)) goto LAB_00213581;
LAB_002143c0:
  xVar30 = status_bad_start_element;
  pbVar41 = pbVar39;
  goto LAB_002142e4;
code_r0x002139e3:
  pxVar13 = pxVar13->parent;
  do {
    pbVar41 = pbVar38;
    bVar18 = *pbVar41;
    pbVar38 = pbVar41 + 1;
  } while (((anonymous_namespace)::chartype_table[bVar18] & 8) != 0);
  pbVar37 = pbVar41;
  bVar19 = bVar2;
  if (bVar18 != 0) {
    pbVar37 = pbVar41 + 1;
    bVar19 = bVar18;
  }
  if (bVar19 != 0x3e) goto LAB_002143da;
  goto LAB_00213581;
LAB_002143da:
  xVar30 = status_bad_end_element;
LAB_002142e4:
  pbVar37 = pbVar41 + -(long)pcVar9;
  if (pbVar41 != (byte *)0x0) {
    pbVar41 = pbVar37;
  }
  if (((long)pbVar41 < 0) || (sVar36 < pbVar41)) {
    __assert_fail("result.offset >= 0 && static_cast<size_t>(result.offset) <= length",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                  ,0xdd9,
                  "static xml_parse_result pugi::impl::(anonymous namespace)::xml_parser::parse(char_t *, size_t, xml_document_struct *, xml_node_struct *, unsigned int)"
                 );
  }
  if (xVar30 == status_ok) {
    if (bVar2 != 0x3c) {
      pbVar39 = pbVar41;
      if ((options >> 0xc & 1) == 0) {
        ppxVar17 = &local_78->next_sibling;
        if (local_78 == (xml_node_struct *)0x0) {
          ppxVar17 = ppxVar1;
        }
        do {
          pxVar13 = *ppxVar17;
          if (pxVar13 == (xml_node_struct *)0x0) {
            local_98->status = status_no_document_element;
            goto LAB_00214389;
          }
          ppxVar17 = &pxVar13->next_sibling;
        } while ((pxVar13->header & 0xf) != 2);
      }
      goto LAB_00214379;
    }
    local_98->status = status_unrecognized_tag;
LAB_00214389:
    local_98->offset = (ptrdiff_t)local_a0;
  }
  else {
    if (pbVar41 == (byte *)0x0) {
      pbVar39 = (byte *)0x0;
    }
    else {
      pbVar39 = pbVar41 + -1;
      if (bVar2 != 0) {
        pbVar39 = pbVar37;
      }
      if (pbVar41 != local_a0) {
        pbVar39 = pbVar37;
      }
    }
LAB_00214379:
    local_98->status = xVar30;
    local_98->offset = (ptrdiff_t)pbVar39;
  }
LAB_00214392:
  local_98->encoding = (xml_encoding)local_a8;
LAB_0021439b:
  pxVar5 = local_98;
  auto_deleter<void>::~auto_deleter(&contents_guard);
  return pxVar5;
}

Assistant:

PUGI__FN xml_parse_result load_buffer_impl(xml_document_struct* doc, xml_node_struct* root, void* contents, size_t size, unsigned int options, xml_encoding encoding, bool is_mutable, bool own, char_t** out_buffer)
	{
		// check input buffer
		if (!contents && size) return make_parse_result(status_io_error);

		// get actual encoding
		xml_encoding buffer_encoding = impl::get_buffer_encoding(encoding, contents, size);

		// if convert_buffer below throws bad_alloc, we still need to deallocate contents if we own it
		auto_deleter<void> contents_guard(own ? contents : 0, xml_memory::deallocate);

		// get private buffer
		char_t* buffer = 0;
		size_t length = 0;

		// coverity[var_deref_model]
		if (!impl::convert_buffer(buffer, length, buffer_encoding, contents, size, is_mutable)) return impl::make_parse_result(status_out_of_memory);

		// after this we either deallocate contents (below) or hold on to it via doc->buffer, so we don't need to guard it
		contents_guard.release();

		// delete original buffer if we performed a conversion
		if (own && buffer != contents && contents) impl::xml_memory::deallocate(contents);

		// grab onto buffer if it's our buffer, user is responsible for deallocating contents himself
		if (own || buffer != contents) *out_buffer = buffer;

		// store buffer for offset_debug
		doc->buffer = buffer;

		// parse
		xml_parse_result res = impl::xml_parser::parse(buffer, length, doc, root, options);

		// remember encoding
		res.encoding = buffer_encoding;

		return res;
	}